

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

exr_result_t exr_attr_string_create(exr_context_t ctxt,exr_attr_string_t *s,char *d)

{
  exr_result_t eVar1;
  exr_attr_string_t *in_RDX;
  exr_context_t in_RSI;
  long in_RDI;
  _internal_exr_context *pctxt;
  int32_t len;
  size_t fulllen;
  int32_t len_00;
  char *d_00;
  
  d_00 = (char *)0x0;
  len_00 = 0;
  if (in_RDX != (exr_attr_string_t *)0x0) {
    d_00 = (char *)strlen((char *)in_RDX);
    if ((char *)0x7ffffffe < d_00) {
      if (in_RDI == 0) {
        return 2;
      }
      eVar1 = (**(code **)(in_RDI + 0x40))(in_RDI,3,"Invalid string too long for attribute");
      return eVar1;
    }
    len_00 = (int32_t)d_00;
  }
  eVar1 = exr_attr_string_create_with_length(in_RSI,in_RDX,d_00,len_00);
  return eVar1;
}

Assistant:

exr_result_t
exr_attr_string_create (exr_context_t ctxt, exr_attr_string_t* s, const char* d)
{
    size_t  fulllen = 0;
    int32_t len     = 0;
    if (d)
    {
        fulllen = strlen (d);
        if (fulllen >= (size_t) INT32_MAX)
        {
            INTERN_EXR_PROMOTE_CONTEXT_OR_ERROR (ctxt);
            return pctxt->report_error (
                pctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "Invalid string too long for attribute");
        }
        len = (int32_t) fulllen;
    }
    return exr_attr_string_create_with_length (ctxt, s, d, len);
}